

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *local_3b0;
  float *hc;
  float *pfStack_3a0;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_380;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_25c;
  float fStack_250;
  float fStack_244;
  float local_238;
  float fStack_21c;
  float fStack_210;
  float fStack_204;
  float local_1f8;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  
  decode = output_buffer;
  pfStack_380 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfStack_3a0 = decode_buffer + ((int)*horizontal_coefficients_local << 2);
    hc._4_4_ = (int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local >> 2;
    local_3b0 = pfStack_380;
    local_1f8 = (float)*(undefined8 *)pfStack_380;
    local_108 = (float)*(undefined8 *)pfStack_3a0;
    fStack_104 = (float)((ulong)*(undefined8 *)pfStack_3a0 >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfStack_3a0 + 2);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 2) >> 0x20);
    fStack_204 = (float)((ulong)*(undefined8 *)pfStack_380 >> 0x20);
    local_128 = (float)*(undefined8 *)(pfStack_3a0 + 4);
    fStack_124 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 4) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfStack_3a0 + 6);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 6) >> 0x20);
    fStack_210 = (float)*(undefined8 *)(pfStack_380 + 2);
    local_148 = (float)*(undefined8 *)(pfStack_3a0 + 8);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 8) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfStack_3a0 + 10);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 10) >> 0x20);
    tot1[2] = local_1f8 * local_108 + fStack_210 * local_148;
    tot1[3] = local_1f8 * fStack_104 + fStack_210 * fStack_144;
    tot0[0] = local_1f8 * fStack_100 + fStack_210 * fStack_140;
    tot0[1] = local_1f8 * fStack_fc + fStack_210 * fStack_13c;
    fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_380 + 2) >> 0x20);
    local_168 = (float)*(undefined8 *)(pfStack_3a0 + 0xc);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0xc) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfStack_3a0 + 0xe);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0xe) >> 0x20);
    c[2] = fStack_204 * local_128 + fStack_21c * local_168;
    c[3] = fStack_204 * fStack_124 + fStack_21c * fStack_164;
    tot1[0] = fStack_204 * fStack_120 + fStack_21c * fStack_160;
    tot1[1] = fStack_204 * fStack_11c + fStack_21c * fStack_15c;
    do {
      uVar1 = *(undefined8 *)(local_3b0 + 4);
      local_238 = (float)uVar1;
      uVar2 = *(undefined8 *)(pfStack_3a0 + 0x10);
      local_188 = (float)uVar2;
      fStack_184 = (float)((ulong)uVar2 >> 0x20);
      fStack_180 = (float)*(undefined8 *)(pfStack_3a0 + 0x12);
      fStack_17c = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x12) >> 0x20);
      fStack_244 = (float)((ulong)uVar1 >> 0x20);
      local_1a8 = (float)*(undefined8 *)(pfStack_3a0 + 0x14);
      fStack_1a4 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x14) >> 0x20);
      fStack_1a0 = (float)*(undefined8 *)(pfStack_3a0 + 0x16);
      fStack_19c = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x16) >> 0x20);
      fStack_250 = (float)*(undefined8 *)(local_3b0 + 6);
      local_1c8 = (float)*(undefined8 *)(pfStack_3a0 + 0x18);
      fStack_1c4 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x18) >> 0x20);
      fStack_1c0 = (float)*(undefined8 *)(pfStack_3a0 + 0x1a);
      fStack_1bc = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x1a) >> 0x20);
      tot1[2] = tot1[2] + local_238 * local_188 + fStack_250 * local_1c8;
      tot1[3] = tot1[3] + local_238 * fStack_184 + fStack_250 * fStack_1c4;
      tot0[0] = tot0[0] + local_238 * fStack_180 + fStack_250 * fStack_1c0;
      tot0[1] = tot0[1] + local_238 * fStack_17c + fStack_250 * fStack_1bc;
      fStack_25c = (float)((ulong)*(undefined8 *)(local_3b0 + 6) >> 0x20);
      local_1e8 = (float)*(undefined8 *)(pfStack_3a0 + 0x1c);
      fStack_1e4 = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x1c) >> 0x20);
      fStack_1e0 = (float)*(undefined8 *)(pfStack_3a0 + 0x1e);
      fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_3a0 + 0x1e) >> 0x20);
      c[2] = c[2] + fStack_244 * local_1a8 + fStack_25c * local_1e8;
      c[3] = c[3] + fStack_244 * fStack_1a4 + fStack_25c * fStack_1e4;
      tot1[0] = tot1[0] + fStack_244 * fStack_1a0 + fStack_25c * fStack_1e0;
      tot1[1] = tot1[1] + fStack_244 * fStack_19c + fStack_25c * fStack_1dc;
      hc._4_4_ = hc._4_4_ + -1;
      local_3b0 = local_3b0 + 4;
      pfStack_3a0 = pfStack_3a0 + 0x10;
    } while (0 < hc._4_4_);
    *(ulong *)decode = CONCAT44(tot1[3] + c[3],tot1[2] + c[2]);
    *(ulong *)(decode + 2) = CONCAT44(tot0[1] + tot1[1],tot0[0] + tot1[0]);
    pfStack_380 = pfStack_380 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 4;
  } while (decode < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}